

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandGen(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Pla_Man_t *pPVar6;
  char *pcVar7;
  uint fVerbose;
  char *pcVar8;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  local_4c = 0;
  Extra_UtilGetoptReset();
  local_44 = 0x14;
  local_48 = 1;
  local_50 = 8;
  bVar1 = false;
  bVar2 = false;
  fVerbose = 0;
LAB_003fd969:
  do {
    while (iVar4 = Extra_UtilGetopt(argc,argv,"IOPSspvh"), iVar3 = globalUtilOptind, iVar4 == 0x76)
    {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar4 < 0x50) {
      if (iVar4 == -1) {
        if (bVar1) {
          Pla_GenSorter(local_50);
          pPVar6 = (Pla_Man_t *)0x0;
        }
        else if (bVar2) {
          pPVar6 = Pla_ManPrimesDetector(local_50);
        }
        else {
          Gia_ManRandom(1);
          for (; local_4c != 0; local_4c = local_4c - 1) {
            Gia_ManRandom(0);
          }
          pPVar6 = Pla_ManGenerate(local_50,local_48,local_44,fVerbose);
        }
        Pla_AbcFreeMan((Abc_Frame_t *)pAbc->pAbcPla);
        pAbc->pAbcPla = pPVar6;
        return 0;
      }
      if (iVar4 == 0x49) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
LAB_003fdb12:
          Abc_Print(-1,pcVar7);
          goto LAB_003fdb1e;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_50 = uVar5;
      }
      else {
        if (iVar4 != 0x4f) goto LAB_003fdb1e;
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-O\" should be followed by an integer.\n";
          goto LAB_003fdb12;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_48 = uVar5;
      }
    }
    else {
      if (0x6f < iVar4) {
        if (iVar4 == 0x70) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        else {
          if (iVar4 != 0x73) goto LAB_003fdb1e;
          bVar1 = (bool)(bVar1 ^ 1);
        }
        goto LAB_003fd969;
      }
      if (iVar4 == 0x50) {
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-P\" should be followed by an integer.\n";
          goto LAB_003fdb12;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_44 = uVar5;
      }
      else {
        if (iVar4 != 0x53) goto LAB_003fdb1e;
        if (argc <= globalUtilOptind) {
          pcVar7 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_003fdb12;
        }
        uVar5 = atoi(argv[globalUtilOptind]);
        local_4c = uVar5;
      }
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar5 < 0) {
LAB_003fdb1e:
      Abc_Print(-2,"usage: |gen [-IOPS num] [-spvh]\n");
      Abc_Print(-2,"\t         generate random or specialized SOP\n");
      Abc_Print(-2,"\t-I num : the number of inputs [default = %d]\n",(ulong)local_50);
      Abc_Print(-2,"\t-O num : the number of outputs [default = %d]\n",(ulong)local_48);
      Abc_Print(-2,"\t-P num : the number of products [default = %d]\n",(ulong)local_44);
      Abc_Print(-2,"\t-S num : ramdom seed (0 <= num <= 1000) [default = %d]\n",(ulong)local_4c);
      pcVar8 = "yes";
      pcVar7 = "yes";
      if (!bVar1) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle generating sorter as a PLA file [default = %s]\n",pcVar7);
      pcVar7 = "yes";
      if (!bVar2) {
        pcVar7 = "no";
      }
      Abc_Print(-2,"\t-p     : toggle generating prime detector [default = %s]\n",pcVar7);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandGen( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int nVars;    // the number of variables
    int nArgs;    // the number of arguments
    int nLutSize = -1; // the size of LUTs
    int nLuts = -1;    // the number of LUTs
    int fAdder;
    int fAdderTree;
    int fSorter;
    int fMesh;
    int fMulti;
    int fBooth;
    int fFpga;
    int fOneHot;
    int fRandom;
    int fVerbose;
    char * FileName;
    char Command[1000];
    extern void Abc_GenAdder( char * pFileName, int nVars );
    extern void Abc_GenSorter( char * pFileName, int nVars );
    extern void Abc_GenMesh( char * pFileName, int nVars );
    extern void Abc_GenMulti( char * pFileName, int nVars );
    extern void Abc_GenBooth( char * pFileName, int nVars );
    extern void Abc_GenFpga( char * pFileName, int nLutSize, int nLuts, int nVars );
    extern void Abc_GenOneHot( char * pFileName, int nVars );
    extern void Abc_GenRandom( char * pFileName, int nPis );
    extern void Abc_GenAdderTree( char * pFileName, int nArgs, int nBits );

    // set defaults
    nVars = 8;
    nArgs = 8;
    fAdder = 0;
    fAdderTree = 0;
    fSorter = 0;
    fMesh = 0;
    fMulti = 0;
    fBooth = 0;
    fFpga = 0;
    fOneHot = 0;
    fRandom = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NAKLatsembfnrvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nVars < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            nArgs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nArgs < 0 )
                goto usage;
            break;
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLutSize < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLuts = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLuts < 0 )
                goto usage;
            break;
        case 'a':
            fAdder ^= 1;
            break;
        case 't':
            fAdderTree ^= 1;
            break;
        case 's':
            fSorter ^= 1;
            break;
        case 'e':
            fMesh ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'b':
            fBooth ^= 1;
            break;
        case 'f':
            fFpga ^= 1;
            break;
        case 'n':
            fOneHot ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }
    if ( nVars < 1 )
    {
        Abc_Print( -1, "The number of variables should be a positive integer.\n" );
        return 0;
    }
    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( fAdder )
        Abc_GenAdder( FileName, nVars );
    else if ( fSorter )
        Abc_GenSorter( FileName, nVars );
    else if ( fMesh )
        Abc_GenMesh( FileName, nVars );
    else if ( fMulti )
        Abc_GenMulti( FileName, nVars );
    else if ( fBooth )
        Abc_GenBooth( FileName, nVars );
    else if ( fFpga )
        Abc_GenFpga( FileName, nLutSize, nLuts, nVars );
//        Abc_GenFpga( FileName, 2, 2, 3 );
//        Abc_GenFpga( FileName, 3, 2, 5 );
    else if ( fOneHot )
        Abc_GenOneHot( FileName, nVars );
    else if ( fRandom )
        Abc_GenRandom( FileName, nVars );
    else if ( fAdderTree )
    {
        printf( "Generating adder tree with %d arguments and %d bits.\n", nArgs, nVars );
        Abc_GenAdderTree( FileName, nArgs, nVars );
        sprintf( Command, "%%read %s; %%blast; &put", FileName );
        Cmd_CommandExecute( pAbc, Command );
        return 0;
    }
    else
    {
        Abc_Print( -1, "Type of circuit is not specified.\n" );
        return 0;
    }
    // read the file just produced
    sprintf(Command, "read %s", FileName );
    Cmd_CommandExecute( pAbc, Command );
    return 0;

usage:
    Abc_Print( -2, "usage: gen [-NAKL num] [-atsembfnrvh] <file>\n" );
    Abc_Print( -2, "\t         generates simple circuits\n" );
    Abc_Print( -2, "\t-N num : the number of variables [default = %d]\n", nVars );
    Abc_Print( -2, "\t-A num : the number of agruments (for adder tree) [default = %d]\n", nArgs );
    Abc_Print( -2, "\t-K num : the LUT size (to be used with switch -f) [default = %d]\n", nLutSize );
    Abc_Print( -2, "\t-L num : the LUT count (to be used with switch -f) [default = %d]\n", nLuts );
    Abc_Print( -2, "\t-a     : generate ripple-carry adder [default = %s]\n", fAdder? "yes": "no" );
    Abc_Print( -2, "\t-t     : generate an adder tree [default = %s]\n", fAdderTree? "yes": "no" );
    Abc_Print( -2, "\t-s     : generate a sorter [default = %s]\n", fSorter? "yes": "no" );
    Abc_Print( -2, "\t-e     : generate a mesh [default = %s]\n", fMesh? "yes": "no" );
    Abc_Print( -2, "\t-m     : generate a multiplier [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-b     : generate a signed Booth multiplier [default = %s]\n", fBooth? "yes": "no" );
    Abc_Print( -2, "\t-f     : generate a LUT FPGA structure [default = %s]\n", fFpga? "yes": "no" );
    Abc_Print( -2, "\t-n     : generate one-hotness conditions [default = %s]\n", fOneHot? "yes": "no" );
    Abc_Print( -2, "\t-r     : generate random single-output function [default = %s]\n", fRandom? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : output file name\n");
    return 1;
}